

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

void post_SOCKS(Curl_easy *data,connectdata *conn,int sockindex,_Bool *connected)

{
  long *plVar1;
  
  (conn->bits).tcpconnect[sockindex] = true;
  *connected = true;
  if (sockindex == 0) {
    Curl_pgrsTime(data,TIMER_CONNECT);
  }
  Curl_updateconninfo(data,conn,conn->sock[sockindex]);
  Curl_verboseconnect(data,conn);
  plVar1 = &(data->info).numconnects;
  *plVar1 = *plVar1 + 1;
  return;
}

Assistant:

static void post_SOCKS(struct Curl_easy *data,
                       struct connectdata *conn,
                       int sockindex,
                       bool *connected)
{
  conn->bits.tcpconnect[sockindex] = TRUE;

  *connected = TRUE;
  if(sockindex == FIRSTSOCKET)
    Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
  Curl_updateconninfo(data, conn, conn->sock[sockindex]);
  Curl_verboseconnect(data, conn);
  data->info.numconnects++; /* to track the number of connections made */
}